

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicCmpxchg
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          AtomicCmpxchg *curr)

{
  Name memoryName;
  Name memoryName_00;
  Name memory;
  undefined1 this_00 [8];
  char *curr_00;
  bool bVar1;
  byte bVar2;
  ExpressionRunner<wasm::ModuleRunner> *pEVar3;
  Address memorySize_00;
  Literal *pLVar4;
  Literal local_298;
  address64_t local_280;
  ModuleRunner *local_278;
  size_t sStack_270;
  Literal local_260;
  Address local_248;
  address64_t local_240;
  ModuleRunner *local_238;
  size_t sStack_230;
  uintptr_t local_220;
  address64_t local_218;
  undefined1 local_210 [8];
  Literal loaded;
  Literal local_1e0;
  Flow local_1c8;
  address64_t local_180;
  Literal local_178;
  Address local_160;
  Address addr;
  Address memorySize;
  undefined1 local_120 [8];
  MemoryInstanceInfo info;
  Flow replacement;
  Flow expected;
  undefined1 local_68 [8];
  Flow ptr;
  AtomicCmpxchg *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  ptr.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar3,*(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x20));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&replacement.breakTo.super_IString.str._M_str,pEVar3,
               *(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x28));
    bVar1 = Flow::breaking((Flow *)&replacement.breakTo.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&replacement.breakTo.super_IString.str._M_str);
    }
    else {
      pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&info.name.super_IString.str._M_str,pEVar3,
                 *(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x30));
      bVar1 = Flow::breaking((Flow *)&info.name.super_IString.str._M_str);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,(Flow *)&info.name.super_IString.str._M_str);
      }
      else {
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)local_120,this,
                   (Name)((IString *)(ptr.breakTo.super_IString.str._M_str + 0x38))->str);
        addr.addr = (address64_t)info.instance;
        memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)info.instance;
        memorySize_00 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_120,memory);
        curr_00 = ptr.breakTo.super_IString.str._M_str;
        this_00 = local_120;
        pLVar4 = Flow::getSingleValue((Flow *)local_68);
        ::wasm::Literal::Literal(&local_178,pLVar4);
        local_180 = memorySize_00.addr;
        local_160 = getFinalAddress<wasm::AtomicCmpxchg>
                              ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,
                               (AtomicCmpxchg *)curr_00,&local_178,memorySize_00);
        ::wasm::Literal::~Literal(&local_178);
        pLVar4 = Flow::getSingleValue((Flow *)&replacement.breakTo.super_IString.str._M_str);
        ::wasm::Literal::Literal((Literal *)&loaded.type,pLVar4);
        wrapToSmallerSize(&local_1e0,this,(Literal *)&loaded.type,
                          (uint)(byte)ptr.breakTo.super_IString.str._M_str[0x10]);
        Flow::Flow(&local_1c8,&local_1e0);
        Flow::operator=((Flow *)&replacement.breakTo.super_IString.str._M_str,&local_1c8);
        Flow::~Flow(&local_1c8);
        ::wasm::Literal::~Literal(&local_1e0);
        ::wasm::Literal::~Literal((Literal *)&loaded.type);
        local_218 = local_160.addr;
        local_220 = *(uintptr_t *)(ptr.breakTo.super_IString.str._M_str + 8);
        local_238 = info.instance;
        sStack_230 = info.name.super_IString.str._M_len;
        memoryName.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memoryName.super_IString.str._M_len = (size_t)info.instance;
        local_240 = memorySize_00.addr;
        doAtomicLoad((Literal *)local_210,(ModuleRunnerBase<wasm::ModuleRunner> *)local_120,
                     local_160,(uint)(byte)ptr.breakTo.super_IString.str._M_str[0x10],
                     (Type)local_220,memoryName,memorySize_00);
        pLVar4 = Flow::getSingleValue((Flow *)&replacement.breakTo.super_IString.str._M_str);
        bVar2 = ::wasm::Literal::operator==((Literal *)local_210,pLVar4);
        if ((bVar2 & 1) != 0) {
          local_248.addr = local_160.addr;
          bVar2 = ptr.breakTo.super_IString.str._M_str[0x10];
          pLVar4 = Flow::getSingleValue((Flow *)&info.name.super_IString.str._M_str);
          ::wasm::Literal::Literal(&local_260,pLVar4);
          local_278 = info.instance;
          sStack_270 = info.name.super_IString.str._M_len;
          memoryName_00.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
          memoryName_00.super_IString.str._M_len = (size_t)info.instance;
          local_280 = memorySize_00.addr;
          doAtomicStore((ModuleRunnerBase<wasm::ModuleRunner> *)local_120,local_248,(uint)bVar2,
                        &local_260,memoryName_00,memorySize_00);
          ::wasm::Literal::~Literal(&local_260);
        }
        ::wasm::Literal::Literal(&local_298,(Literal *)local_210);
        Flow::Flow(__return_storage_ptr__,&local_298);
        ::wasm::Literal::~Literal(&local_298);
        ::wasm::Literal::~Literal((Literal *)local_210);
      }
      Flow::~Flow((Flow *)&info.name.super_IString.str._M_str);
    }
    Flow::~Flow((Flow *)&replacement.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicCmpxchg(AtomicCmpxchg* curr) {
    NOTE_ENTER("AtomicCmpxchg");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    NOTE_EVAL1(ptr);
    auto expected = self()->visit(curr->expected);
    if (expected.breaking()) {
      return expected;
    }
    auto replacement = self()->visit(curr->replacement);
    if (replacement.breaking()) {
      return replacement;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr =
      info.instance->getFinalAddress(curr, ptr.getSingleValue(), memorySize);
    expected = Flow(wrapToSmallerSize(expected.getSingleValue(), curr->bytes));
    NOTE_EVAL1(addr);
    NOTE_EVAL1(expected);
    NOTE_EVAL1(replacement);
    auto loaded = info.instance->doAtomicLoad(
      addr, curr->bytes, curr->type, info.name, memorySize);
    NOTE_EVAL1(loaded);
    if (loaded == expected.getSingleValue()) {
      info.instance->doAtomicStore(
        addr, curr->bytes, replacement.getSingleValue(), info.name, memorySize);
    }
    return loaded;
  }